

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O1

void __thiscall Physical::Physical(Physical *this)

{
  this->_vptr_Physical = (_func_int **)&PTR__Physical_0015e4b0;
  (this->physicalDescription)._M_dataplus._M_p = (pointer)&(this->physicalDescription).field_2;
  (this->physicalDescription)._M_string_length = 0;
  (this->physicalDescription).field_2._M_local_buf[0] = '\0';
  Unit::Unit(&this->physicalUnit);
  this->dQuantity = 0.0;
  return;
}

Assistant:

Physical::Physical()
{
	dQuantity = 0;
}